

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O3

void __thiscall Assimp::ObjFileImporter::~ObjFileImporter(ObjFileImporter *this)

{
  ~ObjFileImporter(this);
  operator_delete(this);
  return;
}

Assistant:

ObjFileImporter::~ObjFileImporter() {
    delete m_pRootObject;
    m_pRootObject = nullptr;
}